

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

void tbx_set_meta(tbx_t *tbx)

{
  uint *puVar1;
  undefined8 uVar2;
  int iVar3;
  uint32_t uVar4;
  void *__ptr;
  size_t sVar5;
  uint8_t *meta_00;
  int x_1;
  kh_s2i_t *d;
  khint_t k;
  uint8_t *meta;
  char **name;
  uint32_t x [7];
  int l_nm;
  int l;
  int i;
  tbx_t *tbx_local;
  
  x[6] = 0;
  puVar1 = (uint *)tbx->dict;
  uVar2 = *(undefined8 *)&tbx->conf;
  x[0] = (tbx->conf).bc;
  x[1] = (tbx->conf).ec;
  x[2] = (tbx->conf).meta_char;
  x[3] = (tbx->conf).line_skip;
  __ptr = malloc((ulong)puVar1[1] << 3);
  x[6] = 0;
  for (d._4_4_ = 0; d._4_4_ != *puVar1; d._4_4_ = d._4_4_ + 1) {
    if ((*(uint *)(*(long *)(puVar1 + 4) + (ulong)(d._4_4_ >> 4) * 4) >>
         (sbyte)((d._4_4_ & 0xf) << 1) & 3) == 0) {
      *(undefined8 *)((long)__ptr + *(long *)(*(long *)(puVar1 + 8) + (ulong)d._4_4_ * 8) * 8) =
           *(undefined8 *)(*(long *)(puVar1 + 6) + (ulong)d._4_4_ * 8);
      sVar5 = strlen(*(char **)(*(long *)(puVar1 + 6) + (ulong)d._4_4_ * 8));
      x[6] = x[6] + (int)sVar5 + 1;
    }
  }
  x[4] = x[6];
  x[5] = x[6];
  meta_00 = (uint8_t *)malloc((long)(int)(x[6] + 0x1c));
  iVar3 = ed_is_big();
  if (iVar3 != 0) {
    for (l_nm = 0; l_nm < 7; l_nm = l_nm + 1) {
      uVar4 = ed_swap_4(x[(long)l_nm + -2]);
      x[(long)l_nm + -2] = uVar4;
    }
  }
  *(undefined8 *)meta_00 = uVar2;
  *(undefined8 *)(meta_00 + 8) = x._0_8_;
  *(undefined8 *)(meta_00 + 0x10) = x._8_8_;
  *(uint32_t *)(meta_00 + 0x18) = x[4];
  x[6] = 0x1c;
  for (l_nm = 0; l_nm < (int)puVar1[1]; l_nm = l_nm + 1) {
    sVar5 = strlen(*(char **)((long)__ptr + (long)l_nm * 8));
    iVar3 = (int)sVar5 + 1;
    memcpy(meta_00 + (int)x[6],*(void **)((long)__ptr + (long)l_nm * 8),(long)iVar3);
    x[6] = iVar3 + x[6];
  }
  free(__ptr);
  hts_idx_set_meta(tbx->idx,x[6],meta_00,0);
  return;
}

Assistant:

void tbx_set_meta(tbx_t *tbx)
{
    int i, l = 0, l_nm;
    uint32_t x[7];
    char **name;
    uint8_t *meta;
    khint_t k;
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;

    memcpy(x, &tbx->conf, 24);
    name = (char**)malloc(sizeof(char*) * kh_size(d));
    for (k = kh_begin(d), l = 0; k != kh_end(d); ++k) {
        if (!kh_exist(d, k)) continue;
        name[kh_val(d, k)] = (char*)kh_key(d, k);
        l += strlen(kh_key(d, k)) + 1; // +1 to include '\0'
    }
    l_nm = x[6] = l;
    meta = (uint8_t*)malloc(l_nm + 28);
    if (ed_is_big())
        for (i = 0; i < 7; ++i)
            x[i] = ed_swap_4(x[i]);
    memcpy(meta, x, 28);
    for (l = 28, i = 0; i < (int)kh_size(d); ++i) {
        int x = strlen(name[i]) + 1;
        memcpy(meta + l, name[i], x);
        l += x;
    }
    free(name);
    hts_idx_set_meta(tbx->idx, l, meta, 0);
}